

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O2

optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
* __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition
          (optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
           *__return_storage_ptr__,SubjectSetRegister *this,uint32_t edition)

{
  iterator iVar1;
  unique_lock<std::mutex> lck;
  uint32_t local_2c;
  unique_lock<std::mutex> local_28;
  
  std::unique_lock<std::mutex>::unique_lock(&local_28,&this->mutex_);
  RemoveEditionsOlderThan(this,edition);
  local_2c = edition;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
          ::find(&(this->subject_set_cache_)._M_t,(key_type *)&local_2c);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
    ._M_engaged = false;
  }
  else {
    std::
    _Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
    ::
    _Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>&>
              ((_Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
                *)__return_storage_ptr__,iVar1._M_node[1]._M_parent);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Subject>> SubjectSetRegister::SubjectSetByEdition(uint32_t edition)
{
    std::unique_lock<std::mutex> lck(mutex_);

    RemoveEditionsOlderThan(edition);

    auto edition_data = subject_set_cache_.find(edition);
    if (edition_data == subject_set_cache_.end())
    {
        return {};
    }

    return edition_data->second->GetSubjects();
}